

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-mutexes.c
# Opt level: O1

int run_test_thread_mutex_recursive(void)

{
  int iVar1;
  int extraout_EAX;
  undefined8 *extraout_RDX;
  uv_rwlock_t *unaff_RBX;
  int iVar2;
  int64_t eval_b;
  int64_t eval_a;
  uv_mutex_t mutex;
  uv_buf_t uStack_148;
  code *pcStack_138;
  long lStack_130;
  long lStack_128;
  sockaddr_in sStack_120;
  uv_cond_t *puStack_110;
  long lStack_108;
  long lStack_100;
  uv_rwlock_t *puStack_f8;
  uv_thread_t uStack_b0;
  uv_rwlock_t *puStack_a8;
  undefined8 uStack_98;
  long lStack_90;
  uv_rwlock_t uStack_88;
  uv_rwlock_t *puStack_50;
  undefined8 local_40;
  long local_38;
  
  puStack_50 = (uv_rwlock_t *)0x1aa916;
  iVar1 = uv_mutex_init_recursive((uv_mutex_t *)&stack0xffffffffffffffd0);
  local_38 = (long)iVar1;
  local_40 = 0;
  if (local_38 == 0) {
    unaff_RBX = (uv_rwlock_t *)&stack0xffffffffffffffd0;
    puStack_50 = (uv_rwlock_t *)0x1aa93f;
    uv_mutex_lock((uv_mutex_t *)unaff_RBX);
    puStack_50 = (uv_rwlock_t *)0x1aa947;
    uv_mutex_lock((uv_mutex_t *)unaff_RBX);
    puStack_50 = (uv_rwlock_t *)0x1aa94f;
    iVar1 = uv_mutex_trylock((uv_mutex_t *)unaff_RBX);
    local_38 = (long)iVar1;
    local_40 = 0;
    if (local_38 == 0) {
      puStack_50 = (uv_rwlock_t *)0x1aa978;
      uv_mutex_unlock((uv_mutex_t *)&stack0xffffffffffffffd0);
      puStack_50 = (uv_rwlock_t *)0x1aa980;
      uv_mutex_unlock((uv_mutex_t *)&stack0xffffffffffffffd0);
      puStack_50 = (uv_rwlock_t *)0x1aa988;
      uv_mutex_unlock((uv_mutex_t *)&stack0xffffffffffffffd0);
      puStack_50 = (uv_rwlock_t *)0x1aa990;
      uv_mutex_destroy((uv_mutex_t *)&stack0xffffffffffffffd0);
      return 0;
    }
  }
  else {
    puStack_50 = (uv_rwlock_t *)0x1aa9a7;
    run_test_thread_mutex_recursive_cold_1();
  }
  puStack_50 = (uv_rwlock_t *)run_test_thread_rwlock;
  run_test_thread_mutex_recursive_cold_2();
  puStack_a8 = (uv_rwlock_t *)0x1aa9c5;
  puStack_50 = unaff_RBX;
  iVar1 = uv_rwlock_init(&uStack_88);
  lStack_90 = (long)iVar1;
  uStack_98 = 0;
  if (lStack_90 == 0) {
    puStack_a8 = (uv_rwlock_t *)0x1aa9ee;
    uv_rwlock_rdlock(&uStack_88);
    puStack_a8 = (uv_rwlock_t *)0x1aa9f6;
    uv_rwlock_rdunlock(&uStack_88);
    puStack_a8 = (uv_rwlock_t *)0x1aa9fe;
    uv_rwlock_wrlock(&uStack_88);
    puStack_a8 = (uv_rwlock_t *)0x1aaa06;
    uv_rwlock_wrunlock(&uStack_88);
    puStack_a8 = (uv_rwlock_t *)0x1aaa0e;
    uv_rwlock_destroy(&uStack_88);
    return 0;
  }
  puStack_a8 = (uv_rwlock_t *)run_test_thread_rwlock_trylock;
  run_test_thread_rwlock_cold_1();
  puStack_a8 = unaff_RBX;
  iVar1 = uv_cond_init(&condvar);
  uStack_b0 = (uv_thread_t)iVar1;
  if (uStack_b0 == 0) {
    iVar1 = uv_mutex_init(&::mutex);
    uStack_b0 = (uv_thread_t)iVar1;
    if (uStack_b0 != 0) goto LAB_001aac9f;
    iVar1 = uv_rwlock_init(&rwlock);
    uStack_b0 = (uv_thread_t)iVar1;
    if (uStack_b0 != 0) goto LAB_001aacae;
    uv_mutex_lock(&::mutex);
    iVar1 = uv_thread_create(&uStack_b0,thread_rwlock_trylock_peer,(void *)0x0);
    if (iVar1 != 0) goto LAB_001aacbd;
    iVar1 = uv_rwlock_trywrlock(&rwlock);
    if (iVar1 != 0) goto LAB_001aaccc;
    synchronize();
    unaff_RBX = &rwlock;
    uv_rwlock_wrunlock(&rwlock);
    iVar1 = uv_rwlock_tryrdlock(&rwlock);
    if (iVar1 != 0) goto LAB_001aacdb;
    synchronize();
    unaff_RBX = &rwlock;
    uv_rwlock_rdunlock(&rwlock);
    synchronize();
    iVar1 = uv_rwlock_tryrdlock(&rwlock);
    if (iVar1 != -0x10) goto LAB_001aacea;
    iVar1 = uv_rwlock_trywrlock(&rwlock);
    if (iVar1 != -0x10) goto LAB_001aacf9;
    synchronize();
    iVar1 = uv_rwlock_tryrdlock(&rwlock);
    if (iVar1 != 0) goto LAB_001aad08;
    unaff_RBX = &rwlock;
    uv_rwlock_rdunlock(&rwlock);
    iVar1 = uv_rwlock_trywrlock(&rwlock);
    if (iVar1 != -0x10) goto LAB_001aad17;
    synchronize();
    iVar1 = uv_thread_join(&uStack_b0);
    if (iVar1 == 0) {
      uv_rwlock_destroy(&rwlock);
      uv_mutex_unlock(&::mutex);
      uv_mutex_destroy(&::mutex);
      uv_cond_destroy(&condvar);
      return 0;
    }
  }
  else {
    run_test_thread_rwlock_trylock_cold_1();
LAB_001aac9f:
    run_test_thread_rwlock_trylock_cold_2();
LAB_001aacae:
    run_test_thread_rwlock_trylock_cold_3();
LAB_001aacbd:
    run_test_thread_rwlock_trylock_cold_4();
LAB_001aaccc:
    run_test_thread_rwlock_trylock_cold_5();
LAB_001aacdb:
    run_test_thread_rwlock_trylock_cold_6();
LAB_001aacea:
    run_test_thread_rwlock_trylock_cold_7();
LAB_001aacf9:
    run_test_thread_rwlock_trylock_cold_8();
LAB_001aad08:
    run_test_thread_rwlock_trylock_cold_9();
LAB_001aad17:
    run_test_thread_rwlock_trylock_cold_10();
  }
  run_test_thread_rwlock_trylock_cold_11();
  uv_mutex_lock(&::mutex);
  iVar1 = uv_rwlock_tryrdlock(&rwlock);
  if (iVar1 == -0x10) {
    iVar1 = uv_rwlock_trywrlock(&rwlock);
    if (iVar1 != -0x10) goto LAB_001aaea4;
    synchronize();
    iVar1 = uv_rwlock_tryrdlock(&rwlock);
    if (iVar1 != 0) goto LAB_001aaeb1;
    unaff_RBX = &rwlock;
    uv_rwlock_rdunlock(&rwlock);
    iVar1 = uv_rwlock_trywrlock(&rwlock);
    if (iVar1 != -0x10) goto LAB_001aaebe;
    synchronize();
    iVar1 = uv_rwlock_trywrlock(&rwlock);
    if (iVar1 != 0) goto LAB_001aaecb;
    synchronize();
    unaff_RBX = &rwlock;
    uv_rwlock_wrunlock(&rwlock);
    iVar1 = uv_rwlock_tryrdlock(&rwlock);
    if (iVar1 == 0) {
      synchronize();
      uv_rwlock_rdunlock(&rwlock);
      step = step + 1;
      uv_cond_signal(&condvar);
      uv_mutex_unlock(&::mutex);
      return extraout_EAX;
    }
  }
  else {
    thread_rwlock_trylock_peer_cold_1();
LAB_001aaea4:
    thread_rwlock_trylock_peer_cold_2();
LAB_001aaeb1:
    thread_rwlock_trylock_peer_cold_3();
LAB_001aaebe:
    thread_rwlock_trylock_peer_cold_4();
LAB_001aaecb:
    thread_rwlock_trylock_peer_cold_5();
  }
  thread_rwlock_trylock_peer_cold_6();
  step = step + 1;
  puStack_110 = (uv_cond_t *)0x1aaf03;
  puStack_f8 = unaff_RBX;
  uv_cond_signal(&condvar);
  iVar1 = step;
  lStack_108 = (long)step;
  do {
    puStack_110 = (uv_cond_t *)0x1aaf1c;
    uv_cond_wait(&condvar,&::mutex);
    lStack_100 = (long)step;
  } while (iVar1 == step);
  lStack_108 = lStack_108 + 1;
  if (lStack_100 == lStack_108) {
    return step;
  }
  puStack_110 = (uv_cond_t *)0x1aaf56;
  synchronize_cold_1();
  puStack_110 = &condvar;
  iVar2 = (int)&lStack_130;
  pcStack_138 = (code *)0x1aaf73;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_120);
  lStack_128 = (long)iVar1;
  lStack_130 = 0;
  if (lStack_128 == 0) {
    pcStack_138 = (code *)0x1aaf9d;
    iVar1 = uv_loop_init(&loop);
    lStack_128 = (long)iVar1;
    lStack_130 = 0;
    if (lStack_128 != 0) goto LAB_001ab143;
    pcStack_138 = (code *)0x1aafce;
    iVar1 = uv_tcp_init(&loop,&tcp_client);
    lStack_128 = (long)iVar1;
    lStack_130 = 0;
    if (lStack_128 != 0) goto LAB_001ab150;
    pcStack_138 = (code *)0x1ab00b;
    iVar1 = uv_tcp_connect(&connect_req,&tcp_client,(sockaddr *)&sStack_120,connect_cb);
    lStack_128 = (long)iVar1;
    lStack_130 = 0;
    if (lStack_128 != 0) goto LAB_001ab15d;
    pcStack_138 = (code *)0x1ab037;
    iVar1 = uv_run(&loop,UV_RUN_DEFAULT);
    lStack_128 = (long)iVar1;
    lStack_130 = 0;
    if (lStack_128 != 0) goto LAB_001ab16a;
    lStack_128 = 1;
    lStack_130 = (long)connect_cb_called;
    if (lStack_130 != 1) goto LAB_001ab177;
    lStack_128 = 1;
    lStack_130 = (long)read_cb_called;
    if (lStack_130 != 1) goto LAB_001ab184;
    lStack_128 = 1;
    lStack_130 = (long)write_cb_called;
    if (lStack_130 != 1) goto LAB_001ab191;
    lStack_128 = 1;
    lStack_130 = (long)close_cb_called;
    if (lStack_130 != 1) goto LAB_001ab19e;
    pcStack_138 = (code *)0x1ab0f9;
    uv_walk(&loop,close_walk_cb,(void *)0x0);
    pcStack_138 = (code *)0x1ab103;
    uv_run(&loop,UV_RUN_DEFAULT);
    lStack_128 = 0;
    pcStack_138 = (code *)0x1ab114;
    iVar1 = uv_loop_close(&loop);
    lStack_130 = (long)iVar1;
    if (lStack_128 == lStack_130) {
      pcStack_138 = (code *)0x1ab12e;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_138 = (code *)0x1ab143;
    run_test_not_readable_nor_writable_on_read_error_cold_1();
LAB_001ab143:
    pcStack_138 = (code *)0x1ab150;
    run_test_not_readable_nor_writable_on_read_error_cold_2();
LAB_001ab150:
    pcStack_138 = (code *)0x1ab15d;
    run_test_not_readable_nor_writable_on_read_error_cold_3();
LAB_001ab15d:
    pcStack_138 = (code *)0x1ab16a;
    run_test_not_readable_nor_writable_on_read_error_cold_4();
LAB_001ab16a:
    pcStack_138 = (code *)0x1ab177;
    run_test_not_readable_nor_writable_on_read_error_cold_5();
LAB_001ab177:
    pcStack_138 = (code *)0x1ab184;
    run_test_not_readable_nor_writable_on_read_error_cold_6();
LAB_001ab184:
    pcStack_138 = (code *)0x1ab191;
    run_test_not_readable_nor_writable_on_read_error_cold_7();
LAB_001ab191:
    pcStack_138 = (code *)0x1ab19e;
    run_test_not_readable_nor_writable_on_read_error_cold_8();
LAB_001ab19e:
    pcStack_138 = (code *)0x1ab1ab;
    run_test_not_readable_nor_writable_on_read_error_cold_9();
  }
  pcStack_138 = connect_cb;
  run_test_not_readable_nor_writable_on_read_error_cold_10();
  connect_cb_called = connect_cb_called + 1;
  uStack_148.base = (char *)(long)iVar2;
  if ((char *)(long)iVar2 == (char *)0x0) {
    iVar1 = uv_read_start((uv_stream_t *)&tcp_client,alloc_cb,read_cb);
    uStack_148.base = (char *)(long)iVar1;
    if ((char *)(long)iVar1 == (char *)0x0) {
      uStack_148 = uv_buf_init(reset_me_cmd,3);
      iVar1 = uv_write(&write_req,(uv_stream_t *)&tcp_client,&uStack_148,1,write_cb);
      pcStack_138 = (code *)0x0;
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_001ab297;
    }
  }
  else {
    connect_cb_cold_1();
  }
  connect_cb_cold_2();
LAB_001ab297:
  connect_cb_cold_3();
  *extraout_RDX = alloc_cb::slab;
  extraout_RDX[1] = 0x40;
  return 0x3893e0;
}

Assistant:

TEST_IMPL(thread_mutex_recursive) {
  uv_mutex_t mutex;
  int r;

  r = uv_mutex_init_recursive(&mutex);
  ASSERT_OK(r);

  uv_mutex_lock(&mutex);
  uv_mutex_lock(&mutex);
  ASSERT_OK(uv_mutex_trylock(&mutex));

  uv_mutex_unlock(&mutex);
  uv_mutex_unlock(&mutex);
  uv_mutex_unlock(&mutex);
  uv_mutex_destroy(&mutex);

  return 0;
}